

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall OpenMD::HBondJumpR::postCorrelate(HBondJumpR *this)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pvVar11;
  
  uVar8 = (ulong)(this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_;
  if (uVar8 != 0) {
    uVar1 = this->nRBins_;
    pvVar3 = (this->counts_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->histogram_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        lVar5 = *(long *)&pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        pvVar11 = (this->histogram_).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10;
        lVar6 = *(long *)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        uVar9 = 0;
        do {
          iVar2 = *(int *)(lVar5 + uVar9 * 4);
          if (iVar2 < 1) {
            *(undefined8 *)
             (*(long *)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + uVar9 * 8) = 0;
          }
          else {
            lVar7 = *(long *)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data;
            *(double *)(lVar7 + uVar9 * 8) = *(double *)(lVar7 + uVar9 * 8) / (double)iVar2;
          }
          *(double *)(lVar6 + uVar9 * 8) = 1.0 - *(double *)(lVar6 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar8);
  }
  return;
}

Assistant:

void HBondJumpR::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nRBins_; ++j) {
        if (counts_[i][j] > 0) {
          histogram_[i][j] /= counts_[i][j];
        } else {
          histogram_[i][j] = 0;
        }
        histogram_[i][j] = 1.0 - histogram_[i][j];
      }
    }
  }